

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

PendingComponent * __thiscall
cmComputeLinkDepends::MakePendingComponent(cmComputeLinkDepends *this,uint component)

{
  long lVar1;
  int iVar2;
  mapped_type *pmVar3;
  long lVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  NodeList *nl;
  
  pmVar3 = std::
           map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
           ::operator[](&this->PendingComponents,
                        (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start + component);
  pmVar3->Id = component;
  lVar1 = *(long *)&(((this->CCG)._M_t.
                      super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
                      .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl)->
                    Components).
                    super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl;
  lVar4 = (long)(int)component * 0x18;
  __first._M_current = *(int **)(lVar1 + lVar4);
  __last._M_current = *(int **)(lVar1 + 8 + lVar4);
  if ((long)__last._M_current - (long)__first._M_current == 4) {
    iVar2 = 1;
  }
  else {
    nl = (NodeList *)(lVar1 + lVar4);
    iVar2 = ComputeComponentCount(this,nl);
    __first._M_current =
         (nl->super_vector<int,_std::allocator<int>_>).super__Vector_base<int,_std::allocator<int>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (nl->super_vector<int,_std::allocator<int>_>).super__Vector_base<int,_std::allocator<int>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  pmVar3->Count = iVar2;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_range_unique<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &pmVar3->Entries,__first,__last);
  return pmVar3;
}

Assistant:

cmComputeLinkDepends::PendingComponent&
cmComputeLinkDepends::MakePendingComponent(unsigned int component)
{
  // Create an entry (in topological order) for the component.
  PendingComponent& pc =
    this->PendingComponents[this->ComponentOrder[component]];
  pc.Id = component;
  NodeList const& nl = this->CCG->GetComponent(component);

  if (nl.size() == 1) {
    // Trivial components need be seen only once.
    pc.Count = 1;
  } else {
    // This is a non-trivial strongly connected component of the
    // original graph.  It consists of two or more libraries
    // (archives) that mutually require objects from one another.  In
    // the worst case we may have to repeat the list of libraries as
    // many times as there are object files in the biggest archive.
    // For now we just list them twice.
    //
    // The list of items in the component has been sorted by the order
    // of discovery in the original BFS of dependencies.  This has the
    // advantage that the item directly linked by a target requiring
    // this component will come first which minimizes the number of
    // repeats needed.
    pc.Count = this->ComputeComponentCount(nl);
  }

  // Store the entries to be seen.
  pc.Entries.insert(nl.begin(), nl.end());

  return pc;
}